

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O1

void __thiscall forwarder::forwarder(forwarder *this,bool internal)

{
  string *psVar1;
  copyable *pcVar2;
  ulong uVar3;
  service *this_00;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *this_01;
  application *paVar6;
  undefined8 uVar7;
  value settings;
  ostringstream oss;
  value local_210;
  value local_208;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  value local_1e0 [2];
  undefined1 local_1d0 [16];
  intrusive_ptr<cppcms::application> local_1c0;
  intrusive_ptr<cppcms::application> *local_1b8;
  int local_1ac;
  intrusive_ptr<cppcms::application> local_1a8 [2];
  application local_198 [16];
  int local_188;
  
  local_1b8 = &this->app_;
  (this->srv).super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->srv).super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->app_).p_ = (application *)0x0;
  cppcms::json::value::copyable::copyable(&local_208.d);
  cppcms::json::value::value<char[5]>(local_1e0,(char (*) [5])"http");
  local_1a8[0].p_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"service","");
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&local_208);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"api","");
  pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1e0[0].d);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  if (local_1a8[0].p_ != local_198) {
    operator_delete(local_1a8[0].p_);
  }
  cppcms::json::value::copyable::~copyable(&local_1e0[0].d);
  local_210.d = (copyable)0x90;
  local_210._1_3_ = 0x1f;
  cppcms::json::value::value<int>(local_1e0,(int *)&local_210);
  local_1a8[0].p_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"service","");
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&local_208);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"port","");
  pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1e0[0].d);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  if (local_1a8[0].p_ != local_198) {
    operator_delete(local_1a8[0].p_);
  }
  cppcms::json::value::copyable::~copyable(&local_1e0[0].d);
  local_210.d = (copyable)0x1;
  cppcms::json::value::value<bool>(local_1e0,(bool *)&local_210);
  local_1a8[0].p_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"service","");
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&local_208);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"disable_global_exit_handling","");
  pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1e0[0].d);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  if (local_1a8[0].p_ != local_198) {
    operator_delete(local_1a8[0].p_);
  }
  cppcms::json::value::copyable::~copyable(&local_1e0[0].d);
  cppcms::json::value::value<char[6]>(local_1e0,(char (*) [6])"/test");
  local_1a8[0].p_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"http","");
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&local_208);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"script_names","");
  uVar3 = cppcms::json::value::operator[](psVar1);
  pcVar2 = (copyable *)cppcms::json::value::operator[](uVar3);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1e0[0].d);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  if (local_1a8[0].p_ != local_198) {
    operator_delete(local_1a8[0].p_);
  }
  cppcms::json::value::copyable::~copyable(&local_1e0[0].d);
  if (internal) {
    cppcms::json::value::value<char[10]>(&local_210,(char (*) [10])"127.0.0.1");
    local_1a8[0].p_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"forwarding","");
    psVar1 = (string *)cppcms::json::value::operator[]((string *)&local_208);
    local_200[0] = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"rules","");
    uVar3 = cppcms::json::value::operator[](psVar1);
    psVar1 = (string *)cppcms::json::value::operator[](uVar3);
    local_1e0[0] = (value)local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"ip","");
    pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
    cppcms::json::value::copyable::operator=(pcVar2,&local_210.d);
    if (local_1e0[0] != (value)local_1d0) {
      operator_delete((void *)local_1e0[0]);
    }
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0]);
    }
    if (local_1a8[0].p_ != local_198) {
      operator_delete(local_1a8[0].p_);
    }
    cppcms::json::value::copyable::~copyable(&local_210.d);
    local_1ac = 0x1f91;
    cppcms::json::value::value<int>(&local_210,&local_1ac);
    local_1a8[0].p_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"forwarding","");
    psVar1 = (string *)cppcms::json::value::operator[]((string *)&local_208);
    local_200[0] = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"rules","");
    uVar3 = cppcms::json::value::operator[](psVar1);
    psVar1 = (string *)cppcms::json::value::operator[](uVar3);
    local_1e0[0] = (value)local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"port","");
    pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
    cppcms::json::value::copyable::operator=(pcVar2,&local_210.d);
    if (local_1e0[0] != (value)local_1d0) {
      operator_delete((void *)local_1e0[0]);
    }
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0]);
    }
    if (local_1a8[0].p_ != local_198) {
      operator_delete(local_1a8[0].p_);
    }
    cppcms::json::value::copyable::~copyable(&local_210.d);
  }
  this_00 = (service *)operator_new(8);
  cppcms::service::service(this_00,&local_208);
  std::__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>::reset<cppcms::service>
            ((__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if (internal) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tesing internal forwarder",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    pcVar4 = (char *)cppcms::service::forwarder();
    cppcms::forwarder::check_forwading_rules_abi_cxx11_((char *)local_1a8,pcVar4,"127.0.0.1:8080");
    if (local_1a8[0].p_ != local_198) {
      operator_delete(local_1a8[0].p_);
    }
    if (local_188 != 0x1f91) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/forwarder_test.cpp"
                 ,0x61);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x50);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 " srv->forwarder().check_forwading_rules(\"127.0.0.1:8080\",\"/test\",\"\").second==8081"
                 ,0x51);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,(string *)local_200);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tesing application level forwarding",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    paVar6 = (application *)operator_new(0x28);
    cppcms::application::application
              (paVar6,(this->srv).super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    *(undefined ***)paVar6 = &PTR__application_0010bb80;
    local_1a8[0].p_ = paVar6;
    booster::intrusive_ptr_add_ref(paVar6);
    paVar6 = (this->app_).p_;
    (this->app_).p_ = local_1a8[0].p_;
    local_1a8[0].p_ = paVar6;
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(local_1a8);
    uVar7 = cppcms::service::applications_pool();
    local_1c0.p_ = local_1b8->p_;
    if (local_1c0.p_ != (application *)0x0) {
      booster::intrusive_ptr_add_ref(local_1c0.p_);
    }
    cppcms::applications_pool::mount(uVar7,&local_1c0);
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_1c0);
  }
  cppcms::json::value::copyable::~copyable(&local_208.d);
  return;
}

Assistant:

forwarder(bool internal)
	{
		cppcms::json::value settings;
		settings["service"]["api"]="http";
		settings["service"]["port"]=8080;
		settings["service"]["disable_global_exit_handling"]=true;
		settings["http"]["script_names"][0]="/test";
		if(internal) {
			settings["forwarding"]["rules"][0]["ip"]="127.0.0.1";
			settings["forwarding"]["rules"][0]["port"]=8081;
		}
		srv.reset(new cppcms::service(settings));

		if(!internal) {
			std::cout << "Tesing application level forwarding" << std::endl;
			app_=new mini_forwarder(*srv);
			srv->applications_pool().mount(app_);
		}
		else {
			std::cout << "Tesing internal forwarder" << std::endl;
			TEST(srv->forwarder().check_forwading_rules("127.0.0.1:8080","/test","").second==8081);
		}

	}